

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O3

void helper_booke206_tlbivax_ppc64(CPUPPCState_conflict2 *env,target_ulong address)

{
  _func_void_DisasContext_ptr_int_int **cpu;
  uint uVar1;
  ppc6xx_tlb_t_conflict2 *ppVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  if ((address & 4) != 0) {
    bVar11 = (address & 8) != 0;
    if (bVar11) {
      iVar8 = 2;
    }
    else {
      iVar8 = 1;
    }
    booke206_flush_tlb(env,iVar8,(uint)bVar11);
    return;
  }
  cpu = &env[-1].spr_cb[0x1bf].oea_write;
  uVar7 = (uint)address;
  if ((address & 8) == 0) {
    uVar9 = (uint)env->spr[0x2b0];
    if (0xffffff < uVar9) {
      uVar10 = uVar9 >> 0x18;
      iVar8 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
        }
      }
      uVar9 = uVar9 & 0xfff;
      if (uVar9 == 0) {
        cVar4 = '\0';
      }
      else {
        iVar3 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
          }
        }
        cVar4 = (char)iVar3;
      }
      uVar6 = 0;
      do {
        uVar5 = uVar6 & uVar10 + 0x7fffffff |
                (~(-1 << (cVar4 - (byte)iVar8 & 0x1f)) & (uint)(address >> 0xc) & 0xfffff) <<
                ((byte)iVar8 & 0x1f);
        if ((uVar5 < uVar9) && (ppVar2 = (env->tlb).tlb6, ppVar2 != (ppc6xx_tlb_t_conflict2 *)0x0))
        {
          uVar1 = *(uint *)((long)&ppVar2[uVar5].pte0 + 4);
          if (((uVar1 >> 0x1e & 1) == 0) &&
             ((ppVar2[uVar5].pte1 & 0xfffffffffffff000) ==
              (ulong)(-0x400 << ((byte)(uVar1 >> 7) & 0x1f) & uVar7 & 0xfffffc00))) {
            *(uint *)((long)&ppVar2[uVar5].pte0 + 4) = uVar1 & 0x3fffffff;
          }
        }
        uVar6 = uVar6 + 1;
      } while (uVar10 != uVar6);
    }
    tlb_flush_page_ppc64((CPUState *)cpu,address & 0xfffffffffffff000);
    return;
  }
  uVar9 = (uint)env->spr[0x2b1];
  if (0xffffff < uVar9) {
    uVar10 = uVar9 >> 0x18;
    iVar8 = 0;
    if (uVar10 != 0) {
      for (; (uVar10 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
      }
    }
    uVar9 = uVar9 & 0xfff;
    if (uVar9 == 0) {
      cVar4 = '\0';
    }
    else {
      iVar3 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
        }
      }
      cVar4 = (char)iVar3;
    }
    uVar6 = 0;
    do {
      uVar5 = uVar6 & uVar10 + 0x7fffffff |
              (~(-1 << (cVar4 - (byte)iVar8 & 0x1f)) & uVar7 >> 0xc) << ((byte)iVar8 & 0x1f);
      if ((uVar5 < uVar9) && (ppVar2 = (env->tlb).tlb6, ppVar2 != (ppc6xx_tlb_t_conflict2 *)0x0)) {
        uVar5 = ((uint)env->spr[0x2b0] & 0xfff) + uVar5;
        uVar1 = *(uint *)((long)&ppVar2[uVar5].pte0 + 4);
        if (((uVar1 >> 0x1e & 1) == 0) &&
           ((ppVar2[uVar5].pte1 & 0xfffffffffffff000) ==
            (ulong)(-0x400 << ((byte)(uVar1 >> 7) & 0x1f) & uVar7 & 0xfffffc00))) {
          *(uint *)((long)&ppVar2[uVar5].pte0 + 4) = uVar1 & 0x3fffffff;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  tlb_flush_ppc64((CPUState *)cpu);
  return;
}

Assistant:

void helper_booke206_tlbivax(CPUPPCState *env, target_ulong address)
{
    CPUState *cs = env_cpu(env);

    if (address & 0x4) {
        /* flush all entries */
        if (address & 0x8) {
            /* flush all of TLB1 */
            booke206_flush_tlb(env, BOOKE206_FLUSH_TLB1, 1);
        } else {
            /* flush all of TLB0 */
            booke206_flush_tlb(env, BOOKE206_FLUSH_TLB0, 0);
        }
        return;
    }

    if (address & 0x8) {
        /* flush TLB1 entries */
        booke206_invalidate_ea_tlb(env, 1, address);
        tlb_flush(cs);
    } else {
        /* flush TLB0 entries */
        booke206_invalidate_ea_tlb(env, 0, address);
        tlb_flush_page(cs, address & MAS2_EPN_MASK);
    }
}